

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_primitives.cc
# Opt level: O3

ostream * operator<<(ostream *os,v_array<substring> *ss)

{
  substring *psVar1;
  
  psVar1 = ss->_begin;
  if (psVar1 != ss->_end) {
    operator<<(os,psVar1);
    psVar1 = psVar1 + 1;
    if (psVar1 != ss->_end) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
        operator<<(os,psVar1);
        psVar1 = psVar1 + 1;
      } while (psVar1 != ss->_end);
    }
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const v_array<substring>& ss)
{
  substring* it = ss.cbegin();

  if (it == ss.cend())
  {
    return os;
  }

  os << *it;

  for (it++; it != ss.cend(); it++)
  {
    os << ",";
    os << *it;
  }

  return os;
}